

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::RegularExpression::matchString
          (RegularExpression *this,Context *context,XMLCh *literal,XMLSize_t *offset,bool ignoreCase
          )

{
  XMLSize_t charCount;
  bool local_42;
  bool match;
  XMLSize_t length;
  bool ignoreCase_local;
  XMLSize_t *offset_local;
  XMLCh *literal_local;
  Context *context_local;
  RegularExpression *this_local;
  
  charCount = XMLString::stringLen(literal);
  if (context->fLimit - *offset < charCount) {
    this_local._7_1_ = false;
  }
  else {
    if (ignoreCase) {
      local_42 = XMLString::regionIMatches(context->fString,(int)*offset,literal,0,charCount);
    }
    else {
      local_42 = XMLString::regionMatches(context->fString,(int)*offset,literal,0,charCount);
    }
    if (local_42 != false) {
      *offset = charCount + *offset;
    }
    this_local._7_1_ = local_42;
  }
  return this_local._7_1_;
}

Assistant:

bool RegularExpression::matchString(Context* const context,
                                    const XMLCh* const literal, XMLSize_t& offset,
                                    const bool ignoreCase) const
{
    XMLSize_t length = XMLString::stringLen(literal);

    if (context->fLimit - offset < length)
        return false;

    bool match = ignoreCase ? XMLString::regionIMatches(context->fString, (int)offset,
                                                        literal, 0, length)
                            : XMLString::regionMatches(context->fString, (int)offset,
                                                       literal, 0, length);
    if (match) offset += length;
    return match;
}